

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaClearElemInfo(xmlSchemaValidCtxtPtr vctxt,xmlSchemaNodeInfoPtr ielem)

{
  xmlChar **ppxVar1;
  xmlSchemaIDCMatcherPtr pxVar2;
  void *pvVar3;
  xmlSchemaPSVIIDCBindingPtr pxVar4;
  int i_1;
  xmlSchemaItemListPtr list;
  xmlSchemaPSVIIDCBindingPtr_conflict bind;
  int i;
  long lVar5;
  xmlSchemaIDCMatcherPtr_conflict pxVar6;
  
  ielem->hasKeyrefs = 0;
  ielem->appliedXPath = 0;
  ppxVar1 = &ielem->localName;
  if ((ielem->flags & 1) == 0) {
    *ppxVar1 = (xmlChar *)0x0;
    ielem->nsName = (xmlChar *)0x0;
  }
  else {
    if (*ppxVar1 != (xmlChar *)0x0) {
      (*xmlFree)(*ppxVar1);
      *ppxVar1 = (xmlChar *)0x0;
    }
    if (ielem->nsName != (xmlChar *)0x0) {
      (*xmlFree)(ielem->nsName);
      ielem->nsName = (xmlChar *)0x0;
    }
  }
  if ((ielem->flags & 2) != 0) {
    if (ielem->value == (xmlChar *)0x0) goto LAB_00187f7e;
    (*xmlFree)(ielem->value);
  }
  ielem->value = (xmlChar *)0x0;
LAB_00187f7e:
  if (ielem->val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(ielem->val);
    ielem->val = (xmlSchemaValPtr)0x0;
  }
  pxVar6 = ielem->idcMatchers;
  if (pxVar6 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    while (pxVar6 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
      pxVar2 = pxVar6->next;
      if (pxVar6->keySeqs != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
        for (lVar5 = 0; lVar5 < pxVar6->sizeKeySeqs; lVar5 = lVar5 + 1) {
          if (pxVar6->keySeqs[lVar5] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
            (*xmlFree)(pxVar6->keySeqs[lVar5]);
            pxVar6->keySeqs[lVar5] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
          }
        }
      }
      list = pxVar6->targets;
      if (list != (xmlSchemaItemListPtr)0x0) {
        if (pxVar6->idcType == 0x18) {
          for (lVar5 = 0; lVar5 < list->nbItems; lVar5 = lVar5 + 1) {
            pvVar3 = list->items[lVar5];
            (*xmlFree)(*(void **)((long)pvVar3 + 8));
            (*xmlFree)(pvVar3);
            list = pxVar6->targets;
          }
        }
        xmlSchemaItemListFree(list);
        pxVar6->targets = (xmlSchemaItemListPtr)0x0;
      }
      if (pxVar6->htab != (xmlHashTablePtr)0x0) {
        xmlHashFree(pxVar6->htab,xmlFreeIDCHashEntry);
        pxVar6->htab = (xmlHashTablePtr)0x0;
      }
      pxVar6->next = (xmlSchemaIDCMatcherPtr)0x0;
      if (vctxt->idcMatcherCache != (xmlSchemaIDCMatcherPtr)0x0) {
        pxVar6->nextCached = vctxt->idcMatcherCache;
      }
      vctxt->idcMatcherCache = pxVar6;
      pxVar6 = pxVar2;
    }
    ielem->idcMatchers = (xmlSchemaIDCMatcherPtr_conflict)0x0;
  }
  bind = ielem->idcTable;
  if (ielem->idcTable != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
    while (bind != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
      pxVar4 = bind->next;
      xmlSchemaIDCFreeBinding(bind);
      bind = pxVar4;
    }
    ielem->idcTable = (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
  }
  if (ielem->regexCtxt != (xmlRegExecCtxtPtr)0x0) {
    xmlRegFreeExecCtxt(ielem->regexCtxt);
    ielem->regexCtxt = (xmlRegExecCtxtPtr)0x0;
  }
  if (ielem->nsBindings != (xmlChar **)0x0) {
    (*xmlFree)(ielem->nsBindings);
    ielem->nsBindings = (xmlChar **)0x0;
    ielem->nbNsBindings = 0;
    ielem->sizeNsBindings = 0;
  }
  return;
}

Assistant:

static void
xmlSchemaClearElemInfo(xmlSchemaValidCtxtPtr vctxt,
		       xmlSchemaNodeInfoPtr ielem)
{
    ielem->hasKeyrefs = 0;
    ielem->appliedXPath = 0;
    if (ielem->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES) {
	FREE_AND_NULL(ielem->localName);
	FREE_AND_NULL(ielem->nsName);
    } else {
	ielem->localName = NULL;
	ielem->nsName = NULL;
    }
    if (ielem->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	FREE_AND_NULL(ielem->value);
    } else {
	ielem->value = NULL;
    }
    if (ielem->val != NULL) {
	/*
	* PSVI TODO: Be careful not to free it when the value is
	* exposed via PSVI.
	*/
	xmlSchemaFreeValue(ielem->val);
	ielem->val = NULL;
    }
    if (ielem->idcMatchers != NULL) {
	/*
	* REVISIT OPTIMIZE TODO: Use a pool of IDC matchers.
	*   Does it work?
	*/
	xmlSchemaIDCReleaseMatcherList(vctxt, ielem->idcMatchers);
#if 0
	xmlSchemaIDCFreeMatcherList(ielem->idcMatchers);
#endif
	ielem->idcMatchers = NULL;
    }
    if (ielem->idcTable != NULL) {
	/*
	* OPTIMIZE TODO: Use a pool of IDC tables??.
	*/
	xmlSchemaIDCFreeIDCTable(ielem->idcTable);
	ielem->idcTable = NULL;
    }
    if (ielem->regexCtxt != NULL) {
	xmlRegFreeExecCtxt(ielem->regexCtxt);
	ielem->regexCtxt = NULL;
    }
    if (ielem->nsBindings != NULL) {
	xmlFree((xmlChar **)ielem->nsBindings);
	ielem->nsBindings = NULL;
	ielem->nbNsBindings = 0;
	ielem->sizeNsBindings = 0;
    }
}